

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::namemorestring(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  size_type sVar1;
  pointer pcVar2;
  uint uVar3;
  Definition *pDVar4;
  ulong uVar5;
  CAddr Value;
  size_type sVar6;
  
  requireDStackDepth(this,1,"NAME>STRING");
  this_00 = &this->dStack;
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  uVar5 = ((long)(this->definitions).
                 super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->definitions).
                 super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
  if (uVar5 < uVar3 || uVar5 - uVar3 == 0) {
    ForthStack<unsigned_int>::setTop(this_00,this->VarOffsetWordBuffer);
    uVar3 = 0;
  }
  else {
    pDVar4 = getDefinition(this,uVar3);
    Value = this->VarOffsetWordBuffer;
    sVar1 = (pDVar4->name)._M_string_length;
    if (sVar1 != 0) {
      pcVar2 = (pDVar4->name)._M_dataplus._M_p;
      sVar6 = 0;
      do {
        dataSpaceSet(this,Value + (int)sVar6,pcVar2[sVar6]);
        sVar6 = sVar6 + 1;
      } while (sVar1 != sVar6);
      Value = this->VarOffsetWordBuffer;
    }
    ForthStack<unsigned_int>::setTop(this_00,Value);
    uVar3 = (uint)(pDVar4->name)._M_string_length;
  }
  ForthStack<unsigned_int>::push(this_00,uVar3);
  return;
}

Assistant:

void namemorestring(){
			REQUIRE_DSTACK_DEPTH(1, "NAME>STRING");
			auto nt=dStack.getTop();
			if(nt>=0 && nt<definitions.size()){
			auto defn=getDefinition(nt);
			auto &name=defn->name;
			moveIntoDataSpace(VarOffsetWordBuffer,name.c_str(),name.size());
			dStack.setTop(VarOffsetWordBuffer);
			dStack.push(CELL(name.size()));
			} else {
				dStack.setTop(VarOffsetWordBuffer);
				dStack.push(0);
			}
		}